

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue op2;
  JSValue op1;
  JSValue v;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  JSValueUnion in_RDX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  long in_R8;
  JSValue JVar3;
  int i;
  JSValue r;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  int64_t local_58;
  JSValueUnion local_50;
  int64_t local_48;
  int local_3c;
  undefined4 in_stack_ffffffffffffffd0;
  int64_t local_8;
  
  JVar3.tag = in_stack_ffffffffffffffa0;
  JVar3.u.float64 = in_stack_ffffffffffffff98.float64;
  JVar3 = JS_ToStringCheckObject(in_stack_ffffffffffffff90,JVar3);
  local_50 = JVar3.u;
  local_48 = JVar3.tag;
  local_8 = local_48;
  local_3c = 0;
  while ((local_3c < in_ECX &&
         (v.tag = local_8, v.u.ptr = local_50.ptr, iVar2 = JS_IsException(v), iVar2 == 0))) {
    JS_DupValue((JSContext *)in_RDI.ptr,*(JSValue *)(in_R8 + (long)local_3c * 0x10));
    op1.tag = (int64_t)local_50.ptr;
    op1.u.float64 = in_RDX.float64;
    op2.tag = in_RSI;
    op2.u.ptr = in_RDI.ptr;
    JVar3 = JS_ConcatString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),op1,op2);
    local_50 = JVar3.u;
    local_58 = JVar3.tag;
    local_8 = local_58;
    local_3c = local_3c + 1;
  }
  JVar1.tag = local_8;
  JVar1.u.ptr = local_50.ptr;
  return JVar1;
}

Assistant:

static JSValue js_string_concat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue r;
    int i;

    /* XXX: Use more efficient method */
    /* XXX: This method is OK if r has a single refcount */
    /* XXX: should use string_buffer? */
    r = JS_ToStringCheckObject(ctx, this_val);
    for (i = 0; i < argc; i++) {
        if (JS_IsException(r))
            break;
        r = JS_ConcatString(ctx, r, JS_DupValue(ctx, argv[i]));
    }
    return r;
}